

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tty.c
# Opt level: O2

int uv_tty_reset_mode(void)

{
  int iVar1;
  uv_spinlock_t uVar2;
  int iVar3;
  int *piVar4;
  
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  LOCK();
  uVar2 = termios_spinlock;
  if (termios_spinlock.lock == 0) {
    termios_spinlock.lock = 1;
    uVar2.lock = 0;
  }
  UNLOCK();
  iVar3 = 0;
  if (uVar2.lock == 0) {
    if (orig_termios_fd != -1) {
      iVar3 = uv__tcsetattr(orig_termios_fd,0,&orig_termios);
    }
    termios_spinlock.lock = 0;
    *piVar4 = iVar1;
  }
  else {
    iVar3 = -0x10;
  }
  return iVar3;
}

Assistant:

int uv_tty_reset_mode(void) {
  int saved_errno;
  int err;

  saved_errno = errno;
  if (!uv_spinlock_trylock(&termios_spinlock))
    return UV_EBUSY;  /* In uv_tty_set_mode(). */

  err = 0;
  if (orig_termios_fd != -1)
    err = uv__tcsetattr(orig_termios_fd, TCSANOW, &orig_termios);

  uv_spinlock_unlock(&termios_spinlock);
  errno = saved_errno;

  return err;
}